

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O3

int hash_c_dleqor(PMBTOKEN_METHOD *method,EC_SCALAR *out,EC_AFFINE *X0,EC_AFFINE *X1,EC_AFFINE *T,
                 EC_AFFINE *S,EC_AFFINE *W,EC_AFFINE *K00,EC_AFFINE *K01,EC_AFFINE *K10,
                 EC_AFFINE *K11)

{
  int iVar1;
  uint uVar2;
  uint8_t *buf;
  size_t len;
  uint8_t *local_78;
  CBB local_70;
  EC_SCALAR *local_40;
  size_t local_38;
  
  local_40 = out;
  CBB_zero(&local_70);
  local_78 = (uint8_t *)0x0;
  iVar1 = CBB_init(&local_70,0);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    iVar1 = CBB_add_bytes(&local_70,"DLEQOR2",8);
    uVar2 = 0;
    if (iVar1 != 0) {
      iVar1 = point_to_cbb(&local_70,method->group,X0);
      if (iVar1 != 0) {
        iVar1 = point_to_cbb(&local_70,method->group,X1);
        if (iVar1 != 0) {
          iVar1 = point_to_cbb(&local_70,method->group,T);
          if (iVar1 != 0) {
            iVar1 = point_to_cbb(&local_70,method->group,S);
            if (iVar1 != 0) {
              iVar1 = point_to_cbb(&local_70,method->group,W);
              if (iVar1 != 0) {
                iVar1 = point_to_cbb(&local_70,method->group,K00);
                if (iVar1 != 0) {
                  iVar1 = point_to_cbb(&local_70,method->group,K01);
                  if (iVar1 != 0) {
                    iVar1 = point_to_cbb(&local_70,method->group,K10);
                    if (iVar1 != 0) {
                      iVar1 = point_to_cbb(&local_70,method->group,K11);
                      if (iVar1 != 0) {
                        iVar1 = CBB_finish(&local_70,&local_78,&local_38);
                        if (iVar1 != 0) {
                          iVar1 = (*method->hash_c)(method->group,local_40,local_78,local_38);
                          uVar2 = (uint)(iVar1 != 0);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  CBB_cleanup(&local_70);
  OPENSSL_free(local_78);
  return uVar2;
}

Assistant:

static int hash_c_dleqor(const PMBTOKEN_METHOD *method, EC_SCALAR *out,
                         const EC_AFFINE *X0, const EC_AFFINE *X1,
                         const EC_AFFINE *T, const EC_AFFINE *S,
                         const EC_AFFINE *W, const EC_AFFINE *K00,
                         const EC_AFFINE *K01, const EC_AFFINE *K10,
                         const EC_AFFINE *K11) {
  static const uint8_t kDLEQOR2Label[] = "DLEQOR2";

  int ok = 0;
  CBB cbb;
  CBB_zero(&cbb);
  uint8_t *buf = NULL;
  size_t len;
  if (!CBB_init(&cbb, 0) ||
      !CBB_add_bytes(&cbb, kDLEQOR2Label, sizeof(kDLEQOR2Label)) ||
      !point_to_cbb(&cbb, method->group, X0) ||
      !point_to_cbb(&cbb, method->group, X1) ||
      !point_to_cbb(&cbb, method->group, T) ||
      !point_to_cbb(&cbb, method->group, S) ||
      !point_to_cbb(&cbb, method->group, W) ||
      !point_to_cbb(&cbb, method->group, K00) ||
      !point_to_cbb(&cbb, method->group, K01) ||
      !point_to_cbb(&cbb, method->group, K10) ||
      !point_to_cbb(&cbb, method->group, K11) ||
      !CBB_finish(&cbb, &buf, &len) ||
      !method->hash_c(method->group, out, buf, len)) {
    goto err;
  }

  ok = 1;

err:
  CBB_cleanup(&cbb);
  OPENSSL_free(buf);
  return ok;
}